

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall
higan::Logger::Logger(Logger *this,LogLevel level,char *full_file_name,int line,char *func_name)

{
  uint uVar1;
  int iVar2;
  int64_t time;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  string thread_id_;
  TimeStamp local_38;
  TimeStamp stamp;
  
  memset(this,0,0x210);
  this->level_ = level;
  uVar1 = System::GetTid();
  time = TimeStamp::Now();
  TimeStamp::TimeStamp(&local_38,time);
  sVar3 = (this->buffer_).write_idx_;
  sVar3 = TimeStamp::FormatToBuffer(&local_38,(this->buffer_).buffer_ + sVar3,0x200 - sVar3);
  sVar3 = sVar3 + (this->buffer_).write_idx_;
  if (0x1ff < sVar3) {
    sVar3 = 0x200;
  }
  (this->buffer_).write_idx_ = sVar3;
  pcVar4 = strrchr(full_file_name,0x2f);
  pcVar6 = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    pcVar6 = full_file_name;
  }
  iVar2 = snprintf((this->buffer_).buffer_ + sVar3,0x200 - sVar3," [pid: %d] [%s] [%s:%d - %s] ",
                   (ulong)uVar1,G_LEVEL_TO_STRING[(int)level],pcVar6,(ulong)(uint)line,func_name);
  uVar5 = (long)iVar2 + (this->buffer_).write_idx_;
  if (0x1ff < uVar5) {
    uVar5 = 0x200;
  }
  (this->buffer_).write_idx_ = uVar5;
  TimeStamp::~TimeStamp(&local_38);
  return;
}

Assistant:

Logger::Logger(LogLevel level, const char* full_file_name, int line, const char* func_name):
		level_(level)
{
	std::string thread_id_;

	pid_t pid = System::GetTid();

	TimeStamp stamp(TimeStamp::Now());
	buffer_.AddWriteIndex(stamp.FormatToBuffer(buffer_.WriteBegin(), buffer_.WritableSize()));

	const char* file_name = strrchr(full_file_name, '/');
	if (file_name)
	{
		file_name += 1;
	}
	else
	{
		file_name = full_file_name;
	}

	buffer_.AddWriteIndex(snprintf(buffer_.WriteBegin(), buffer_.WritableSize(),
			" [pid: %d] [%s] [%s:%d - %s] ",
			pid,
			G_LEVEL_TO_STRING[static_cast<int>(level)],
			file_name,
			line,
			func_name));
}